

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

ThresholdParameter * __thiscall
caffe::V1LayerParameter::mutable_threshold_param(V1LayerParameter *this)

{
  ThresholdParameter *this_00;
  V1LayerParameter *this_local;
  
  set_has_threshold_param(this);
  if (this->threshold_param_ == (ThresholdParameter *)0x0) {
    this_00 = (ThresholdParameter *)operator_new(0x20);
    ThresholdParameter::ThresholdParameter(this_00);
    this->threshold_param_ = this_00;
  }
  return this->threshold_param_;
}

Assistant:

inline ::caffe::ThresholdParameter* V1LayerParameter::mutable_threshold_param() {
  set_has_threshold_param();
  if (threshold_param_ == NULL) {
    threshold_param_ = new ::caffe::ThresholdParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V1LayerParameter.threshold_param)
  return threshold_param_;
}